

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  bool bVar1;
  uint count;
  uint64_t uVar2;
  byte bVar3;
  undefined4 extraout_EAX;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  byte bVar7;
  secp256k1_ge *in_RCX;
  secp256k1_ge *a;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  secp256k1_ge *data;
  secp256k1_ge *a_00;
  secp256k1_scalar *r;
  secp256k1_ge *buf;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  size_t sStack_118;
  undefined1 auStack_110 [56];
  uint64_t uStack_d8;
  uint64_t uStack_d0;
  uint64_t uStack_c8;
  undefined8 uStack_80;
  int *piStack_78;
  secp256k1_scalar *psStack_70;
  ulong uStack_68;
  
  data = (secp256k1_ge *)s;
  secp256k1_scalar_verify(s);
  auVar14._0_4_ = -(uint)((int)s->d[2] == 0 && (int)s->d[0] == 0);
  auVar14._4_4_ = -(uint)(*(int *)((long)s->d + 0x14) == 0 && *(int *)((long)s->d + 4) == 0);
  auVar14._8_4_ = -(uint)((int)s->d[3] == 0 && (int)s->d[1] == 0);
  auVar14._12_4_ = -(uint)(*(int *)((long)s->d + 0x1c) == 0 && *(int *)((long)s->d + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar14);
  if (iVar4 == 0xf) {
    uVar8 = 0;
    if (-1 < (int)(0x7f / (long)w)) {
      uVar8 = 0;
      memset(wnaf,0,(0x7f / (long)w & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    secp256k1_scalar_verify(s);
    uVar2 = s->d[0];
    r = s;
    secp256k1_scalar_verify(s);
    if (w - 0x21U < 0xffffffe0) {
      secp256k1_wnaf_fixed_cold_1();
      a_00 = data;
      buf = a;
      piStack_78 = wnaf;
      psStack_70 = s;
      uStack_68 = (ulong)(uint)w;
      secp256k1_ge_verify(a);
      if (a->infinity == 0) {
        secp256k1_ge_verify(in_RCX);
        if ((in_RCX->infinity == 0) && (iVar4 = secp256k1_ge_eq_var(a,in_RCX), iVar4 != 0)) {
          r->d[0] = 1;
          r->d[1] = 0;
          r->d[2] = 0;
          r->d[3] = 0;
          secp256k1_scalar_verify(r);
          return extraout_EAX_01;
        }
        sStack_118 = 0x21;
        auStack_110._48_8_ = 0x6a480de6ef02c5a;
        uStack_d8 = 0x1d1134f21f298665;
        uStack_d0 = 0x52da414756a0b063;
        uStack_c8 = 0x4484be15f280d9d4;
        uStack_80 = 0x40;
        secp256k1_sha256_write((secp256k1_sha256 *)(auStack_110 + 0x30),(uchar *)data,0x20);
        a_00 = (secp256k1_ge *)auStack_110;
        buf = a;
        iVar4 = secp256k1_eckey_pubkey_serialize(a,(uchar *)a_00,&sStack_118,1);
        if ((iVar4 != 0) && (sStack_118 == 0x21)) {
          secp256k1_sha256_write((secp256k1_sha256 *)(auStack_110 + 0x30),auStack_110,0x21);
          secp256k1_sha256_finalize((secp256k1_sha256 *)(auStack_110 + 0x30),auStack_110);
          secp256k1_scalar_set_b32(r,auStack_110,(int *)0x0);
          return extraout_EAX_00;
        }
      }
      else {
        secp256k1_musig_keyaggcoef_internal_cold_1();
      }
      secp256k1_musig_keyaggcoef_internal_cold_2();
      secp256k1_ge_verify(a_00);
      if (a_00->infinity == 0) {
        secp256k1_ge_to_bytes((uchar *)buf,a_00);
        return extraout_EAX_03;
      }
      (buf->y).n[0] = 0;
      (buf->y).n[1] = 0;
      (buf->x).n[4] = 0;
      (buf->x).magnitude = 0;
      (buf->x).normalized = 0;
      (buf->x).n[2] = 0;
      (buf->x).n[3] = 0;
      (buf->x).n[0] = 0;
      (buf->x).n[1] = 0;
      return extraout_EAX_02;
    }
    uVar8 = ~(uint)uVar2 & 1;
    secp256k1_scalar_verify(s);
    bVar7 = (byte)w;
    *wnaf = ((uint)((int)s->d[w - 1U >> 6] << (-bVar7 & 0x1f)) >> (-bVar7 & 0x1f)) + uVar8;
    bVar3 = 0x7f / bVar7;
    uVar12 = (ulong)bVar3;
    uVar9 = (uint)bVar3;
    uVar11 = 0x80 - (uint)bVar3 * w;
    uVar13 = uVar12;
    do {
      uVar10 = w;
      if (uVar13 == uVar12) {
        uVar10 = uVar11;
      }
      uVar5 = secp256k1_scalar_get_bits_var(s,(uint)uVar13 * w,uVar10);
      uVar10 = (uint)uVar13;
      if (uVar5 != 0) break;
      wnaf[uVar13] = 0;
      uVar9 = uVar9 - 1;
      bVar1 = 1 < (long)uVar13;
      uVar13 = uVar13 - 1;
      uVar10 = uVar9;
    } while (bVar1);
    if (0 < (int)uVar10) {
      iVar4 = -1 << (bVar7 & 0x1f);
      uVar13 = 1;
      uVar9 = w;
      do {
        count = w;
        if (uVar12 == uVar13) {
          count = uVar11;
        }
        uVar5 = secp256k1_scalar_get_bits_var(s,uVar9,count);
        if ((uVar5 & 1) == 0) {
          wnaf[uVar13 - 1] = wnaf[uVar13 - 1] + iVar4;
          uVar5 = uVar5 | 1;
        }
        wnaf[uVar13] = uVar5;
        if (1 < uVar13) {
          if (wnaf[uVar13 - 1] == -1) {
            if (0 < wnaf[uVar13 - 2]) {
              iVar6 = wnaf[uVar13 - 2] + iVar4;
              goto LAB_00150b6e;
            }
          }
          else if ((wnaf[uVar13 - 1] == 1) && (wnaf[uVar13 - 2] < 0)) {
            iVar6 = wnaf[uVar13 - 2] + (1 << (bVar7 & 0x1f));
LAB_00150b6e:
            wnaf[uVar13 - 2] = iVar6;
            wnaf[uVar13 - 1] = 0;
          }
        }
        uVar13 = uVar13 + 1;
        uVar9 = uVar9 + w;
      } while (uVar10 + 1 != uVar13);
    }
  }
  return uVar8;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}